

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

Vec_Ptr_t * Saig_ManBmcTerSim(Aig_Man_t *p)

{
  bool bVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  undefined4 local_30;
  int CountIncrease;
  int TerCur;
  int TerPrev;
  int i;
  uint *pInfo;
  Vec_Ptr_t *vInfos;
  Aig_Man_t *p_local;
  
  _TerPrev = (uint *)0x0;
  CountIncrease = 1000000000;
  local_30 = 0;
  p_00 = Vec_PtrAlloc(100);
  TerCur = 0;
  while( true ) {
    bVar1 = false;
    if ((TerCur < 1000) && (bVar1 = false, local_30 < 5)) {
      bVar1 = 0 < CountIncrease;
    }
    if (!bVar1) break;
    iVar2 = Saig_ManBmcTerSimCount01(p,_TerPrev);
    if (CountIncrease <= iVar2) {
      local_30 = local_30 + 1;
    }
    _TerPrev = Saig_ManBmcTerSimOne(p,_TerPrev);
    Vec_PtrPush(p_00,_TerPrev);
    TerCur = TerCur + 1;
    CountIncrease = iVar2;
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSim( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, TerPrev = ABC_INFINITY, TerCur, CountIncrease = 0;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; i < 1000 && CountIncrease < 5 && TerPrev > 0; i++ )
    {
        TerCur = Saig_ManBmcTerSimCount01( p, pInfo );
        if ( TerCur >= TerPrev )
            CountIncrease++;
        TerPrev = TerCur;
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
    }
    return vInfos;
}